

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportTargetCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,TargetType targetType)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string targetName;
  string local_80;
  string local_60 [32];
  string local_40;
  
  std::__cxx11::string::string(local_60,(string *)&this->Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_80,target);
  std::__cxx11::string::append(local_60);
  std::__cxx11::string::~string((string *)&local_80);
  poVar2 = std::operator<<(os,"# Create imported target ");
  poVar2 = std::operator<<(poVar2,local_60);
  std::operator<<(poVar2,"\n");
  switch(targetType) {
  case EXECUTABLE:
    poVar2 = std::operator<<(os,"add_executable(");
    poVar2 = std::operator<<(poVar2,local_60);
    pcVar3 = " IMPORTED)\n";
    break;
  case STATIC_LIBRARY:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_60);
    pcVar3 = " STATIC IMPORTED)\n";
    break;
  case SHARED_LIBRARY:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_60);
    pcVar3 = " SHARED IMPORTED)\n";
    break;
  case MODULE_LIBRARY:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_60);
    pcVar3 = " MODULE IMPORTED)\n";
    break;
  case OBJECT_LIBRARY:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_60);
    pcVar3 = " OBJECT IMPORTED)\n";
    break;
  default:
    goto switchD_003db3b8_caseD_5;
  case INTERFACE_LIBRARY:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_60);
    pcVar3 = " INTERFACE IMPORTED)\n";
    break;
  case UNKNOWN_LIBRARY:
    poVar2 = std::operator<<(os,"add_library(");
    poVar2 = std::operator<<(poVar2,local_60);
    pcVar3 = " UNKNOWN IMPORTED)\n";
  }
  std::operator<<(poVar2,pcVar3);
switchD_003db3b8_caseD_5:
  bVar1 = cmGeneratorTarget::IsExecutableWithExports(target);
  if (!bVar1) {
    bVar1 = cmGeneratorTarget::IsSharedLibraryWithExports(target);
    if (!bVar1) goto LAB_003db545;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"",(allocator<char> *)&local_40);
    bVar1 = cmGeneratorTarget::HasImportLibrary(target,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (!bVar1) goto LAB_003db545;
  }
  poVar2 = std::operator<<(os,"set_property(TARGET ");
  poVar2 = std::operator<<(poVar2,local_60);
  std::operator<<(poVar2," PROPERTY ENABLE_EXPORTS 1)\n");
LAB_003db545:
  bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_60);
    std::operator<<(poVar2," PROPERTY FRAMEWORK 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsAppBundleOnApple(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_60);
    std::operator<<(poVar2," PROPERTY MACOSX_BUNDLE 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsCFBundleOnApple(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_60);
    std::operator<<(poVar2," PROPERTY BUNDLE 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsDeprecated(target);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_60);
    poVar2 = std::operator<<(poVar2," PROPERTY DEPRECATION ");
    cmGeneratorTarget::GetDeprecation_abi_cxx11_(&local_40,target);
    cmExportFileGeneratorEscape(&local_80,&local_40);
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"IMPORTED_NO_SYSTEM",(allocator<char> *)&local_40);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_60);
    std::operator<<(poVar2," PROPERTY IMPORTED_NO_SYSTEM 1)\n");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"EXPORT_NO_SYSTEM",(allocator<char> *)&local_40);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1) {
    poVar2 = std::operator<<(os,"set_property(TARGET ");
    poVar2 = std::operator<<(poVar2,local_60);
    std::operator<<(poVar2," PROPERTY SYSTEM 0)\n");
  }
  std::operator<<(os,"\n");
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType targetType)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports() ||
      (target->IsSharedLibraryWithExports() && target->HasImportLibrary(""))) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }

  // generate DEPRECATION
  if (target->IsDeprecated()) {
    os << "set_property(TARGET " << targetName << " PROPERTY DEPRECATION "
       << cmExportFileGeneratorEscape(target->GetDeprecation()) << ")\n";
  }

  if (target->GetPropertyAsBool("IMPORTED_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY IMPORTED_NO_SYSTEM 1)\n";
  }

  if (target->GetPropertyAsBool("EXPORT_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName << " PROPERTY SYSTEM 0)\n";
  }

  os << "\n";
}